

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O0

int Mio_CommandPrintProfile(Abc_Frame_t *pAbc,int argc,char **argv)

{
  FILE *pFile;
  int iVar1;
  FILE *__stream;
  void *pvVar2;
  Mio_Library_t *pLib;
  int c;
  int fVerbose;
  int fSelected;
  int fShort;
  FILE *pErr;
  FILE *pOut;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
LAB_004b89d9:
  iVar1 = Extra_UtilGetopt(argc,argv,"savh");
  if (iVar1 == -1) {
    pvVar2 = Abc_FrameReadLibGen();
    pFile = _stdout;
    if (pvVar2 != (void *)0x0) {
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      Mio_LibraryWriteProfile(pFile,pLib);
    }
    else {
      printf("Library is not available.\n");
    }
    pAbc_local._4_4_ = (uint)(pvVar2 == (void *)0x0);
    return pAbc_local._4_4_;
  }
  switch(iVar1) {
  case 0x61:
    goto LAB_004b89d9;
  default:
    break;
  case 0x68:
    break;
  case 0x73:
    goto LAB_004b89d9;
  case 0x76:
    goto switchD_004b8a17_caseD_76;
  }
  fprintf(__stream,"\nusage: print_profile [-h]\n");
  fprintf(__stream,"\t          print the current gate profile\n");
  fprintf(__stream,"\t-h      : print the command usage\n");
  return 1;
switchD_004b8a17_caseD_76:
  goto LAB_004b89d9;
}

Assistant:

int Mio_CommandPrintProfile( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pOut, * pErr;
    int fShort = 0;
    int fSelected = 0;
    int fVerbose = 0;
    int c;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "savh")) != EOF ) 
    {
        switch (c) 
        {
            case 's':
                fShort ^= 1;
                break;
            case 'a':
                fSelected ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( Abc_FrameReadLibGen() == NULL )
    {
        printf( "Library is not available.\n" );
        return 1;
    }
    Mio_LibraryWriteProfile( stdout, (Mio_Library_t *)Abc_FrameReadLibGen() );
    return 0;

usage:
    fprintf( pErr, "\nusage: print_profile [-h]\n");
    fprintf( pErr, "\t          print the current gate profile\n" );  
    fprintf( pErr, "\t-h      : print the command usage\n");
    return 1;       
}